

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameWithClusterInfo.cpp
# Opt level: O0

void __thiscall
BayesianGameWithClusterInfo::BayesianGameWithClusterInfo
          (BayesianGameWithClusterInfo *this,PlanningUnitDecPOMDPDiscrete *pu,
          QFunctionJAOHInterface *q,Index t,BGwCI_constPtr *prevBG,
          shared_ptr<const_JointPolicyDiscretePure> *prevJPolBG,size_t nrAgents,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *nrActions,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *nrTypes,
          BGClusterAlgorithm clusterAlg,double thresholdJB,double thresholdPjaoh)

{
  size_t sVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  long in_RDX;
  PlanningUnitDecPOMDPDiscrete *in_RDI;
  pointer in_XMM0_Qa;
  pointer in_XMM1_Qa;
  shared_ptr<const_BayesianGameWithClusterInfo> *in_stack_00000018;
  undefined4 in_stack_00000020;
  shared_ptr<const_BayesianGameWithClusterInfo> *in_stack_ffffffffffffff50;
  allocator_type *this_01;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff78;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *pvVar2;
  size_t in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  QFunctionJAOHInterface *in_stack_ffffffffffffff90;
  BayesianGameForDecPOMDPStage *in_stack_ffffffffffffffa0;
  size_t *psVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffb0;
  
  BayesianGameForDecPOMDPStage::BayesianGameForDecPOMDPStage
            (in_stack_ffffffffffffffa0,in_RDI,in_stack_ffffffffffffff90,
             (Index)((ulong)in_stack_ffffffffffffff88 >> 0x20),in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78,in_stack_ffffffffffffffb0);
  (in_RDI->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit =
       (_func_int **)&PTR__BayesianGameWithClusterInfo_00d06ad0;
  *(undefined ***)&(in_RDI->super_PlanningUnitMADPDiscrete).super_PlanningUnit._m_seed =
       &PTR__BayesianGameWithClusterInfo_00d06b20;
  boost::shared_ptr<const_BayesianGameWithClusterInfo>::shared_ptr
            (in_stack_ffffffffffffff50,in_stack_00000018);
  psVar3 = &(in_RDI->super_PlanningUnitMADPDiscrete)._m_nrJointActionObservationHistories;
  if (in_RDX == 0) {
    sVar1 = 0;
  }
  else {
    sVar1 = __dynamic_cast(in_RDX,&QFunctionJAOHInterface::typeinfo,
                           &QFunctionJointBeliefInterface::typeinfo,0xfffffffffffffffe);
  }
  *psVar3 = sVar1;
  pvVar2 = &(in_RDI->super_PlanningUnitMADPDiscrete)._m_nrActionObservationHistoriesT;
  if (in_RDX == 0) {
    this_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  }
  else {
    this_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
              __dynamic_cast(in_RDX,&QFunctionJAOHInterface::typeinfo,&QHybrid::typeinfo,0);
  }
  (pvVar2->
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)this_00;
  boost::shared_ptr<const_JointPolicyDiscretePure>::shared_ptr
            ((shared_ptr<const_JointPolicyDiscretePure> *)in_stack_ffffffffffffff50,
             (shared_ptr<const_JointPolicyDiscretePure> *)in_stack_00000018);
  this_01 = (allocator_type *)
            &(in_RDI->super_PlanningUnitMADPDiscrete)._m_nrJointActionObservationHistoriesT;
  sVar1 = BayesianGameBase::GetNrJointTypes((BayesianGameBase *)this_01);
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x8bb96f);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(this_00,sVar1,this_01);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x8bb98f);
  std::
  vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  ::vector((vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
            *)0x8bb9a0);
  *(undefined4 *)
   &(in_RDI->super_PlanningUnitMADPDiscrete)._m_firstJAOHIforT.
    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
    super__Vector_impl_data._M_start = in_stack_00000020;
  (in_RDI->super_PlanningUnitMADPDiscrete)._m_firstJAOHIforT.
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = in_XMM0_Qa;
  (in_RDI->super_PlanningUnitMADPDiscrete)._m_firstJAOHIforT.
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_XMM1_Qa;
  return;
}

Assistant:

BayesianGameWithClusterInfo::BayesianGameWithClusterInfo(                
        const PlanningUnitDecPOMDPDiscrete* pu,
        const QFunctionJAOHInterface* q,
        Index t,
        const BGwCI_constPtr &prevBG,
        const boost::shared_ptr<const JointPolicyDiscretePure> &prevJPolBG,
        size_t nrAgents,
        const vector<size_t>& nrActions,
        const vector<size_t>& nrTypes,
        BGClusterAlgorithm clusterAlg,
        double thresholdJB,
        double thresholdPjaoh
    )
        :

            BayesianGameForDecPOMDPStage( 
                    pu, q, t, nrAgents, nrActions, nrTypes)
            ,_m_pBG(prevBG)
            ,_m_qJB(dynamic_cast<const QFunctionJointBeliefInterface *>(q))
            ,_m_qHybrid(dynamic_cast<const QHybrid *>(q))
            ,_m_pBGJPol(prevJPolBG)
            //,_m_JBs( GetNrJointTypes() )
            ,_m_jaohReps( GetNrJointTypes() )
            ,_m_clusterAlgorithm(clusterAlg),
            _m_thresholdJB(thresholdJB),
            _m_thresholdPjaoh(thresholdPjaoh)
{
}